

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fits_read_image_speed
              (fitsfile *infptr,float *whole_elapse,float *whole_cpu,float *row_elapse,
              float *row_cpu,int *status)

{
  uint uVar1;
  void *array;
  long lVar2;
  long *plVar3;
  long *plVar4;
  uchar cnull;
  int anynull;
  short snull;
  float *local_1a8;
  float *local_1a0;
  float *local_198;
  float *local_190;
  float enull;
  int inull;
  int bitpix;
  float local_17c;
  long naxes [9];
  double dnull;
  int naxis;
  long fpixel [9];
  long lpixel [9];
  long inc [9];
  
  cnull = '\0';
  snull = 0;
  inull = 0;
  plVar3 = &DAT_001c9ce0;
  plVar4 = fpixel;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *plVar4 = *plVar3;
    plVar3 = plVar3 + 1;
    plVar4 = plVar4 + 1;
  }
  plVar3 = &DAT_001c9ce0;
  plVar4 = lpixel;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *plVar4 = *plVar3;
    plVar3 = plVar3 + 1;
    plVar4 = plVar4 + 1;
  }
  plVar3 = &DAT_001c9ce0;
  plVar4 = inc;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *plVar4 = *plVar3;
    plVar3 = plVar3 + 1;
    plVar4 = plVar4 + 1;
  }
  enull = 0.0;
  dnull = 0.0;
  if (*status != 0) {
    return *status;
  }
  local_190 = whole_elapse;
  ffgipr(infptr,9,&bitpix,&naxis,naxes,status);
  if (naxis != 2) goto LAB_0010b567;
  uVar1 = -bitpix;
  if (0 < bitpix) {
    uVar1 = bitpix;
  }
  lpixel[0] = naxes[0];
  lpixel[1] = naxes[1];
  local_17c = (float)((double)naxes[1] * ((double)(long)((ulong)uVar1 * naxes[0]) / 8000000.0));
  ffpscl(infptr,1.0,0.0,status);
  *local_190 = 0.0;
  *whole_cpu = 0.0;
  if (bitpix < 8) {
    if (bitpix == -0x40) {
      array = calloc(naxes[0] * naxes[1],8);
      marktime(status);
      ffgsv(infptr,0x52,fpixel,lpixel,inc,&dnull,array,&anynull,status);
      gettime(local_190,whole_cpu,status);
      if (row_elapse != (float *)0x0) {
        marktime(status);
        if (0 < naxes[1]) {
          lVar2 = 0;
          local_1a8 = row_elapse;
          local_1a0 = whole_cpu;
          local_198 = row_cpu;
          do {
            lVar2 = lVar2 + 1;
            fpixel[1] = lVar2;
            ffgpxv(infptr,0x52,fpixel,naxes[0],&dnull,array,&anynull,status);
            whole_cpu = local_1a0;
            row_elapse = local_1a8;
            row_cpu = local_198;
          } while (lVar2 < naxes[1]);
        }
        goto LAB_0010b502;
      }
      goto LAB_0010b510;
    }
    if (bitpix == -0x20) {
      array = calloc(naxes[0] * naxes[1],4);
      marktime(status);
      ffgsv(infptr,0x2a,fpixel,lpixel,inc,&enull,array,&anynull,status);
      gettime(local_190,whole_cpu,status);
      if (row_elapse != (float *)0x0) {
        marktime(status);
        if (0 < naxes[1]) {
          lVar2 = 0;
          local_1a8 = row_elapse;
          local_1a0 = whole_cpu;
          local_198 = row_cpu;
          do {
            lVar2 = lVar2 + 1;
            fpixel[1] = lVar2;
            ffgpxv(infptr,0x2a,fpixel,naxes[0],&enull,array,&anynull,status);
            whole_cpu = local_1a0;
            row_elapse = local_1a8;
            row_cpu = local_198;
          } while (lVar2 < naxes[1]);
        }
        goto LAB_0010b502;
      }
      goto LAB_0010b510;
    }
  }
  else {
    if (bitpix == 0x20) {
      array = calloc(naxes[1] * naxes[0],4);
      marktime(status);
      ffgsv(infptr,0x1f,fpixel,lpixel,inc,&inull,array,&anynull,status);
      gettime(local_190,whole_cpu,status);
      if (row_elapse != (float *)0x0) {
        marktime(status);
        if (0 < naxes[1]) {
          lVar2 = 0;
          local_1a8 = row_elapse;
          local_1a0 = whole_cpu;
          local_198 = row_cpu;
          do {
            lVar2 = lVar2 + 1;
            fpixel[1] = lVar2;
            ffgpxv(infptr,0x1f,fpixel,naxes[0],&inull,array,&anynull,status);
            whole_cpu = local_1a0;
            row_elapse = local_1a8;
            row_cpu = local_198;
          } while (lVar2 < naxes[1]);
        }
LAB_0010b502:
        gettime(row_elapse,row_cpu,status);
      }
    }
    else if (bitpix == 0x10) {
      array = calloc(naxes[1] * naxes[0],2);
      marktime(status);
      ffgsv(infptr,0x15,fpixel,lpixel,inc,&snull,array,&anynull,status);
      gettime(local_190,whole_cpu,status);
      if (row_elapse != (float *)0x0) {
        marktime(status);
        if (0 < naxes[1]) {
          lVar2 = 0;
          local_1a8 = row_elapse;
          local_1a0 = whole_cpu;
          local_198 = row_cpu;
          do {
            lVar2 = lVar2 + 1;
            fpixel[1] = lVar2;
            ffgpxv(infptr,0x15,fpixel,naxes[0],&snull,array,&anynull,status);
            whole_cpu = local_1a0;
            row_elapse = local_1a8;
            row_cpu = local_198;
          } while (lVar2 < naxes[1]);
        }
        goto LAB_0010b502;
      }
    }
    else {
      if (bitpix != 8) goto LAB_0010b51d;
      array = calloc(naxes[0] * naxes[1],1);
      marktime(status);
      ffgsv(infptr,0xb,fpixel,lpixel,inc,&cnull,array,&anynull,status);
      gettime(local_190,whole_cpu,status);
      if (row_elapse != (float *)0x0) {
        marktime(status);
        if (0 < naxes[1]) {
          lVar2 = 0;
          local_1a8 = row_elapse;
          local_1a0 = whole_cpu;
          local_198 = row_cpu;
          do {
            lVar2 = lVar2 + 1;
            fpixel[1] = lVar2;
            ffgpxv(infptr,0xb,fpixel,naxes[0],&cnull,array,&anynull,status);
            whole_cpu = local_1a0;
            row_elapse = local_1a8;
            row_cpu = local_198;
          } while (lVar2 < naxes[1]);
        }
        goto LAB_0010b502;
      }
    }
LAB_0010b510:
    free(array);
  }
LAB_0010b51d:
  *local_190 = *local_190 / local_17c;
  if (row_elapse != (float *)0x0) {
    *row_elapse = *row_elapse / local_17c;
  }
  *whole_cpu = *whole_cpu / local_17c;
  if (row_cpu != (float *)0x0) {
    *row_cpu = *row_cpu / local_17c;
  }
LAB_0010b567:
  return *status;
}

Assistant:

int fits_read_image_speed (fitsfile *infptr, float *whole_elapse, 
    float *whole_cpu, float *row_elapse, float *row_cpu, int *status)
{
        unsigned char *carray, cnull = 0;
	short *sarray, snull=0;
	int bitpix, naxis, anynull, *iarray, inull = 0;
	long ii, naxes[9], fpixel[9]={1,1,1,1,1,1,1,1,1}, lpixel[9]={1,1,1,1,1,1,1,1,1};
	long inc[9]={1,1,1,1,1,1,1,1,1} ;
	float *earray, enull = 0, filesize;
	double *darray, dnull = 0;
	
	if (*status) return(*status);

	fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, status);

	if (naxis != 2)return(*status);
	
	lpixel[0] = naxes[0];
	lpixel[1] = naxes[1];
	
        /* filesize in MB */
	filesize = (float) (naxes[0] * abs(bitpix) / 8000000. * naxes[1]);

	/* measure time required to read the raw image */
	fits_set_bscale(infptr, 1.0, 0.0, status);
	*whole_elapse = 0.;
	*whole_cpu = 0;

        if (bitpix == BYTE_IMG) {
		carray = calloc(naxes[1]*naxes[0], sizeof(char));

                /* remove any cached uncompressed tile 
		  (dangerous to directly modify the structure!) */
         /*       (infptr->Fptr)->tilerow = 0; */

		marktime(status);
		fits_read_subset(infptr, TBYTE, fpixel, lpixel, inc, &cnull, 
		      carray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {

                  /* remove any cached uncompressed tile 
	  	    (dangerous to directly modify the structure!) */
          /*        (infptr->Fptr)->tilerow = 0; */

		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TBYTE, fpixel, naxes[0], &cnull, 
		      carray, &anynull, status);
		   }
		   /* get elapsped times */
		   gettime(row_elapse, row_cpu, status);
		}
 		free(carray);
 
	} else if (bitpix == SHORT_IMG) {
		sarray = calloc(naxes[0]*naxes[1], sizeof(short));

		marktime(status);
		fits_read_subset(infptr, TSHORT, fpixel, lpixel, inc, &snull, 
		      sarray, &anynull, status);

		gettime(whole_elapse, whole_cpu, status);   /* get elapsped times */

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {

		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TSHORT, fpixel, naxes[0], &snull, 
		      sarray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

		free(sarray);	

	} else if (bitpix == LONG_IMG) {
		iarray = calloc(naxes[0]*naxes[1], sizeof(int));

		marktime(status);

		fits_read_subset(infptr, TINT, fpixel, lpixel, inc, &inull, 
		      iarray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);


		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TINT, fpixel, naxes[0], &inull, 
		      iarray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}


 		free(iarray);	

	} else if (bitpix == FLOAT_IMG)   {
		earray = calloc(naxes[1]*naxes[0], sizeof(float));

		marktime(status);

		fits_read_subset(infptr, TFLOAT, fpixel, lpixel, inc, &enull, 
		      earray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TFLOAT, fpixel, naxes[0], &enull, 
		      earray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

 		free(earray);	

	} else if (bitpix == DOUBLE_IMG)  {
		darray = calloc(naxes[1]*naxes[0], sizeof(double));

		marktime(status);

		fits_read_subset(infptr, TDOUBLE, fpixel, lpixel, inc, &dnull, 
		      darray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TDOUBLE, fpixel, naxes[0], &dnull, 
		      darray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

		free(darray);
	}

        if (whole_elapse) *whole_elapse = *whole_elapse / filesize;
        if (row_elapse)   *row_elapse   = *row_elapse / filesize;
        if (whole_cpu)    *whole_cpu    = *whole_cpu / filesize;
        if (row_cpu)      *row_cpu      = *row_cpu / filesize;

	return(*status);
}